

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O1

mraa_platform_t mraa_x86_platform(void)

{
  char *__s1;
  int iVar1;
  int iVar2;
  FILE *__stream;
  __ssize_t _Var3;
  size_t sVar4;
  ssize_t sVar5;
  mraa_platform_t mVar6;
  char *pcVar7;
  mraa_boolean_t turbot;
  char *line;
  size_t len;
  char buffer [20];
  char *local_48;
  size_t local_40;
  char local_38 [32];
  
  local_48 = (char *)0x0;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_40 = 0;
  __stream = fopen("/sys/devices/virtual/dmi/id/board_name","r");
  if (__stream == (FILE *)0x0) {
    __stream = fopen("/proc/cmdline","r");
    if (__stream != (FILE *)0x0) {
      _Var3 = getline(&local_48,&local_40,__stream);
      if (_Var3 != -1) {
        pcVar7 = strstr(local_48,"sf3gr_mrd_version=P2.0");
        if (pcVar7 == (char *)0x0) {
LAB_00115032:
          mVar6 = MRAA_UNKNOWN_PLATFORM;
        }
        else {
          plat = mraa_intel_sofia_3gr();
          mVar6 = MRAA_INTEL_SOFIA_3GR;
        }
        goto LAB_0011507f;
      }
      goto LAB_00114ff1;
    }
    mVar6 = MRAA_UNKNOWN_PLATFORM;
  }
  else {
    _Var3 = getline(&local_48,&local_40,__stream);
    pcVar7 = local_48;
    if (_Var3 == -1) {
LAB_00114ff1:
      mVar6 = MRAA_UNKNOWN_PLATFORM;
    }
    else {
      sVar4 = strcspn(local_48,"\r\n");
      __s1 = local_48;
      pcVar7[sVar4] = '\0';
      iVar1 = strncmp(local_48,"GalileoGen2",0xc);
      if ((iVar1 == 0) || (iVar1 = strncmp(__s1,"SIMATIC IOT2000",0x10), iVar1 == 0)) {
        plat = mraa_intel_galileo_gen2();
        mVar6 = MRAA_INTEL_GALILEO_GEN2;
      }
      else {
        iVar1 = strncmp(__s1,"BODEGA BAY",0xb);
        if ((iVar1 == 0) || (iVar1 = strncmp(__s1,"SALT BAY",9), iVar1 == 0)) {
          plat = mraa_intel_edison_fab_c();
          mVar6 = MRAA_INTEL_EDISON_FAB_C;
        }
        else {
          iVar1 = strncmp(__s1,"DE3815",7);
          if (iVar1 == 0) {
            plat = mraa_intel_de3815();
            mVar6 = MRAA_INTEL_DE3815;
          }
          else {
            iVar1 = strncmp(__s1,"NUC5i5MYBE",0xb);
            if ((iVar1 == 0) || (iVar1 = strncmp(__s1,"NUC5i3MYBE",0xb), iVar1 == 0)) {
              plat = mraa_intel_nuc5();
              mVar6 = MRAA_INTEL_NUC5;
            }
            else {
              iVar1 = strncmp(__s1,"NOTEBOOK",9);
              if ((iVar1 == 0) || (iVar1 = strncasecmp(__s1,"MinnowBoard MAX",0x10), iVar1 == 0)) {
                turbot = 0;
LAB_0011506b:
                plat = mraa_intel_minnowboard_byt_compatible(turbot);
                mVar6 = MRAA_INTEL_MINNOWBOARD_MAX;
              }
              else {
                iVar1 = strncasecmp(__s1,"Galileo",8);
                if (iVar1 == 0) {
                  mVar6 = MRAA_INTEL_GALILEO_GEN1;
                  plat = mraa_intel_galileo_rev_d();
                }
                else {
                  iVar1 = strncasecmp(__s1,"MinnowBoard Compatible",0x17);
                  if ((iVar1 == 0) ||
                     (iVar1 = strncasecmp(__s1,"MinnowBoard Turbot",0x13), iVar1 == 0)) {
                    turbot = 1;
                    goto LAB_0011506b;
                  }
                  iVar1 = strncasecmp(__s1,"Braswell Cherry Hill",0x15);
                  if (iVar1 == 0) {
                    plat = mraa_intel_cherryhills();
                    mVar6 = MRAA_INTEL_CHERRYHILLS;
                  }
                  else {
                    iVar1 = strncasecmp(__s1,"Intel Learning Kit",0x13);
                    if (iVar1 == 0) {
                      plat = mraa_intel_ilk();
                      mVar6 = MRAA_INTEL_ILK;
                    }
                    else {
                      iVar1 = strncasecmp(__s1,"UP-CHT01",9);
                      if (iVar1 == 0) {
                        plat = mraa_up_board();
                        mVar6 = MRAA_UP;
                      }
                      else {
                        iVar1 = strncasecmp(__s1,"UP-APL01",9);
                        if (iVar1 == 0) {
                          plat = mraa_up2_board();
                          mVar6 = MRAA_UP2;
                        }
                        else {
                          iVar1 = strncasecmp(__s1,"RVP",4);
                          if ((iVar1 == 0) || (iVar1 = strncasecmp(__s1,"SDS",4), iVar1 == 0)) {
                            plat = mraa_joule_expansion_board();
                            mVar6 = MRAA_INTEL_GT_TUCHUCK;
                          }
                          else {
                            iVar1 = strncasecmp(__s1,"SAF3",5);
                            if (iVar1 == 0) {
                              plat = mraa_iei_tank();
                              mVar6 = MRAA_IEI_TANK;
                            }
                            else {
                              iVar1 = strncasecmp(__s1,"LEC-ALAI",9);
                              if ((iVar1 == 0) || (iVar1 = strncasecmp(__s1,"LEC-AL",7), iVar1 == 0)
                                 ) {
                                plat = mraa_lec_al_board();
                                mVar6 = MRAA_ADLINK_LEC_AL;
                              }
                              else {
                                iVar1 = strncasecmp(__s1,"UP-WHL01",9);
                                if (iVar1 != 0) {
                                  syslog(3,"Platform not supported, not initialising");
                                  goto LAB_00115032;
                                }
                                plat = mraa_upxtreme_board();
                                mVar6 = MRAA_UPXTREME;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0011507f:
      free(local_48);
    }
    fclose(__stream);
  }
  iVar1 = open("/sys/devices/virtual/dmi/id/product_name",0);
  if (iVar1 == -1) {
    return mVar6;
  }
  syslog(3,"Checking additional Platform support for LEC-AL iPI");
  sVar5 = read(iVar1,local_38,10);
  if (sVar5 < 1) {
    return mVar6;
  }
  iVar2 = strncasecmp(local_38,"LEC-AL-AI",9);
  if (iVar2 == 0) {
    mVar6 = MRAA_ADLINK_LEC_AL_AI;
    pcVar7 = "LEC-AL AI IPi found. starting MRAA";
  }
  else {
    iVar2 = strncasecmp(local_38,"LEC-AL",6);
    if (iVar2 != 0) goto LAB_0011513f;
    mVar6 = MRAA_ADLINK_LEC_AL;
    pcVar7 = "LEC-AL IPi found. starting MRAA";
  }
  syslog(3,pcVar7);
  plat = mraa_lec_al_board();
LAB_0011513f:
  close(iVar1);
  return mVar6;
}

Assistant:

mraa_platform_t
mraa_x86_platform()
{
#ifndef MRAA_PLATFORM_FORCE
    mraa_platform_t platform_type = MRAA_UNKNOWN_PLATFORM;

    char* line = NULL, buffer[20] = {0};
    // let getline allocate memory for *line
    size_t len = 0;
    FILE* fh = fopen("/sys/devices/virtual/dmi/id/board_name", "r");
    int fd;

    if (fh != NULL) {
        if (getline(&line, &len, fh) != -1) {
            // Sanitize input by terminating at any of possible end of line chars
            line[strcspn(line, "\r\n")] = 0;

            if (strncmp(line, "GalileoGen2", strlen("GalileoGen2") + 1) == 0 ||
                strncmp(line, "SIMATIC IOT2000", strlen("SIMATIC IOT2000") + 1) == 0) {
                platform_type = MRAA_INTEL_GALILEO_GEN2;
                plat = mraa_intel_galileo_gen2();
            } else if (strncmp(line, "BODEGA BAY", strlen("BODEGA BAY") + 1) == 0) {
                platform_type = MRAA_INTEL_EDISON_FAB_C;
                plat = mraa_intel_edison_fab_c();
            } else if (strncmp(line, "SALT BAY", strlen("SALT BAY") + 1) == 0) {
                platform_type = MRAA_INTEL_EDISON_FAB_C;
                plat = mraa_intel_edison_fab_c();
            } else if (strncmp(line, "DE3815", strlen("DE3815") + 1) == 0) {
                platform_type = MRAA_INTEL_DE3815;
                plat = mraa_intel_de3815();
            } else if (strncmp(line, "NUC5i5MYBE", strlen("NUC5i5MYBE") + 1) == 0 ||
                       strncmp(line, "NUC5i3MYBE", strlen("NUC5i3MYBE") + 1) == 0) {
                platform_type = MRAA_INTEL_NUC5;
                plat = mraa_intel_nuc5();
            } else if (strncmp(line, "NOTEBOOK", strlen("NOTEBOOK") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(0);
            } else if (strncasecmp(line, "MinnowBoard MAX", strlen("MinnowBoard MAX") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(0);
            } else if (strncasecmp(line, "Galileo", strlen("Galileo") + 1) == 0) {
                platform_type = MRAA_INTEL_GALILEO_GEN1;
                plat = mraa_intel_galileo_rev_d();
            } else if (strncasecmp(line, "MinnowBoard Compatible", strlen("MinnowBoard Compatible") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(1);
            } else if (strncasecmp(line, "MinnowBoard Turbot", strlen("MinnowBoard Turbot") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(1);
            } else if (strncasecmp(line, "Braswell Cherry Hill", strlen("Braswell Cherry Hill") + 1) == 0) {
                platform_type = MRAA_INTEL_CHERRYHILLS;
                plat = mraa_intel_cherryhills();
            } else if (strncasecmp(line, "Intel Learning Kit", strlen("Intel Learning Kit") + 1) == 0) {
                platform_type = MRAA_INTEL_ILK;
                plat = mraa_intel_ilk();
            } else if (strncasecmp(line, "UP-CHT01", strlen("UP-CHT01") + 1) == 0) {
                platform_type = MRAA_UP;
                plat = mraa_up_board();
            } else if (strncasecmp(line, "UP-APL01", strlen("UP-APL01") + 1) == 0) {
                platform_type = MRAA_UP2;
                plat = mraa_up2_board();
            } else if (strncasecmp(line, "RVP", strlen("RVP") + 1) == 0) {
                platform_type = MRAA_INTEL_JOULE_EXPANSION;
                plat = mraa_joule_expansion_board();
            } else if (strncasecmp(line, "SDS", strlen("SDS") + 1) == 0) {
                platform_type = MRAA_INTEL_JOULE_EXPANSION;
                plat = mraa_joule_expansion_board();
            } else if ((strncasecmp(line, "SAF3", strlen("SAF3") + 1) == 0) ) {
                platform_type = MRAA_IEI_TANK;
                plat = mraa_iei_tank();
            } else if ((strncasecmp(line, "LEC-ALAI", strlen("LEC-ALAI") + 1) == 0) ) {
                platform_type = MRAA_ADLINK_LEC_AL;
                plat = mraa_lec_al_board();
	    } else if ((strncasecmp(line, "LEC-AL", strlen("LEC-AL") + 1) == 0) ) {
                platform_type = MRAA_ADLINK_LEC_AL;
                plat = mraa_lec_al_board();
            } else if (strncasecmp(line, "UP-WHL01", strlen("UP-WHL01") + 1) == 0) {
                platform_type = MRAA_UPXTREME;
                plat = mraa_upxtreme_board();
            } else {
                syslog(LOG_ERR, "Platform not supported, not initialising");
                platform_type = MRAA_UNKNOWN_PLATFORM;
            }
            free(line);
        }
        fclose(fh);
    } else {
        fh = fopen("/proc/cmdline", "r");
        if (fh != NULL) {
            if (getline(&line, &len, fh) != -1) {
                if (strstr(line, "sf3gr_mrd_version=P2.0")) {
                    platform_type = MRAA_INTEL_SOFIA_3GR;
                    plat = mraa_intel_sofia_3gr();
                }
                free(line);
            }
            fclose(fh);
        }
    }

    if( (fd = open("/sys/devices/virtual/dmi/id/product_name", O_RDONLY)) != -1) {
	    syslog(LOG_ERR, "Checking additional Platform support for LEC-AL iPI");
	    if(read(fd, buffer, 10) > 0) {
		    if ((strncasecmp(buffer, "LEC-AL-AI", strlen("LEC-AL-AI")) == 0)) {
			    syslog(LOG_ERR, "LEC-AL AI IPi found. starting MRAA");
			    platform_type = MRAA_ADLINK_LEC_AL_AI;
			    plat = mraa_lec_al_board();
		    }
		    else if ((strncasecmp(buffer, "LEC-AL", strlen("LEC-AL")) == 0)) {
			    syslog(LOG_ERR, "LEC-AL IPi found. starting MRAA");
			    platform_type = MRAA_ADLINK_LEC_AL;
			    plat = mraa_lec_al_board();
		    }
		    close(fd);
	    }
    }

    return platform_type;
#else
    #if defined(xMRAA_INTEL_GALILEO_GEN2)
    plat = mraa_intel_galileo_gen2();
    #elif defined(xMRAA_INTEL_EDISON_FAB_C)
    plat = mraa_intel_edison_fab_c();
    #elif defined(xMRAA_INTEL_DE3815)
    plat = mraa_intel_de3815();
    #elif defined(xMRAA_INTEL_MINNOWBOARD_MAX)
    plat = mraa_intel_minnowboard_byt_compatible();
    #elif defined(xMRAA_INTEL_GALILEO_GEN1)
    plat = mraa_intel_galileo_rev_d();
    #elif defined(xMRAA_INTEL_NUC5)
    plat = mraa_intel_nuc5();
    #elif defined(xMRAA_INTEL_SOFIA_3GR)
    plat = mraa_intel_sofia_3gr();
    #elif defined(xMRAA_INTEL_CHERRYHILLS)
    plat = mraa_intel_cherryhills();
    #elif defined(xMRAA_UP)
    plat = mraa_up_board();
    #elif defined(xMRAA_UP2)
    plat = mraa_up2_board();
    #elif defined(xMRAA_INTEL_JOULE_EXPANSION)
    plat = mraa_joule_expansion_board();
    #elif defined(xMRAA_IEI_TANK)
    plat = mraa_iei_tank();
    #elif defined(xMRAA_UPXTREME)
    plat = mraa_upxtreme_board();
    #else
        #error "Not using a valid platform value from mraa_platform_t - cannot compile"
    #endif
    return MRAA_PLATFORM_FORCE;
#endif
}